

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborcommon.cpp
# Opt level: O0

QString * __thiscall QCborError::toString(QCborError *this)

{
  int iVar1;
  QByteArrayView ba;
  int *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  CborError err;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_2;
  char16_t *str_3;
  char16_t *str_4;
  char16_t *str_5;
  char16_t *str_6;
  char16_t *str_11;
  char16_t *str_7;
  char16_t *str_8;
  char16_t *str_9;
  char16_t *str_10;
  char16_t *str_12;
  char16_t *str_13;
  undefined4 in_stack_fffffffffffffc88;
  CborError in_stack_fffffffffffffc8c;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffc90;
  QArrayDataPointer<char16_t> *this_00;
  char **in_stack_fffffffffffffc98;
  QByteArrayView *in_stack_fffffffffffffca0;
  QString *pQVar2;
  QArrayDataPointer<char16_t> local_158;
  QArrayDataPointer<char16_t> local_140;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char16_t> local_110;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_e0;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  QArrayDataPointer<char16_t> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *in_RSI;
  if (iVar1 == 0) {
    QString::QString((QString *)0x46468e);
  }
  else if (iVar1 == 1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_20,(Data *)0x0,L"Unknown error",0xd);
    QString::QString((QString *)in_stack_fffffffffffffc90,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc90);
  }
  else if (iVar1 == 3) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_38,(Data *)0x0,L"Read past end of buffer (more bytes needed)",0x2b);
    QString::QString((QString *)in_stack_fffffffffffffc90,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc90);
  }
  else if (iVar1 == 4) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_50,(Data *)0x0,L"Input/Output error",0x12)
    ;
    QString::QString((QString *)in_stack_fffffffffffffc90,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc90);
  }
  else if (iVar1 == 0x100) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_68,(Data *)0x0,L"Data found after the end of the stream",0x26);
    QString::QString((QString *)in_stack_fffffffffffffc90,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc90);
  }
  else if (iVar1 == 0x101) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_80,(Data *)0x0,L"Unexpected end of input data (more bytes needed)",0x30);
    QString::QString((QString *)in_stack_fffffffffffffc90,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc90);
  }
  else if (iVar1 == 0x102) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_98,(Data *)0x0,L"Invalid CBOR stream: unexpected \'break\' byte",0x2c);
    QString::QString((QString *)in_stack_fffffffffffffc90,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc90);
  }
  else if (iVar1 == 0x103) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_b0,(Data *)0x0,L"Invalid CBOR stream: unknown type",0x21);
    QString::QString((QString *)in_stack_fffffffffffffc90,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc90);
  }
  else if (iVar1 == 0x104) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_c8,(Data *)0x0,L"Invalid CBOR stream: illegal type found",0x27);
    QString::QString((QString *)in_stack_fffffffffffffc90,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc90);
  }
  else if (iVar1 == 0x105) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_e0,(Data *)0x0,
               L"Invalid CBOR stream: illegal number encoding (future extension)",0x3f);
    QString::QString((QString *)in_stack_fffffffffffffc90,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc90);
  }
  else if (iVar1 == 0x106) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_f8,(Data *)0x0,L"Invalid CBOR stream: illegal simple type",0x28);
    QString::QString((QString *)in_stack_fffffffffffffc90,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc90);
  }
  else if (iVar1 == 0x204) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_110,(Data *)0x0,L"Invalid CBOR stream: invalid UTF-8 text string",0x2e);
    QString::QString((QString *)in_stack_fffffffffffffc90,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc90);
  }
  else if (iVar1 == 0x400) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_128,(Data *)0x0,L"Internal limitation: data set too large",0x27);
    QString::QString((QString *)in_stack_fffffffffffffc90,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc90);
  }
  else if (iVar1 == 0x401) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_140,(Data *)0x0,L"Internal limitation: data nesting too deep",0x2a);
    QString::QString((QString *)in_stack_fffffffffffffc90,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc90);
  }
  else if (iVar1 == 0x402) {
    this_00 = &local_158;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (this_00,(Data *)0x0,L"Internal limitation: unsupported type",0x25);
    QString::QString((QString *)this_00,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  }
  else {
    pQVar2 = in_RDI;
    cbor_error_string(in_stack_fffffffffffffc8c);
    QByteArrayView::QByteArrayView<const_char_*,_true>
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    ba.m_data = (storage_type *)pQVar2;
    ba.m_size = (qsizetype)in_RSI;
    QString::fromLatin1(ba);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QCborError::toString() const
{
    switch (c) {
    case NoError:
        static_assert(int(NoError) == int(CborNoError));
        return QString();

    case UnknownError:
        static_assert(int(UnknownError) == int(CborUnknownError));
        return QStringLiteral("Unknown error");
    case AdvancePastEnd:
        static_assert(int(AdvancePastEnd) == int(CborErrorAdvancePastEOF));
        return QStringLiteral("Read past end of buffer (more bytes needed)");
    case InputOutputError:
        static_assert(int(InputOutputError) == int(CborErrorIO));
        return QStringLiteral("Input/Output error");
    case GarbageAtEnd:
        static_assert(int(GarbageAtEnd) == int(CborErrorGarbageAtEnd));
        return QStringLiteral("Data found after the end of the stream");
    case EndOfFile:
        static_assert(int(EndOfFile) == int(CborErrorUnexpectedEOF));
        return QStringLiteral("Unexpected end of input data (more bytes needed)");
    case UnexpectedBreak:
        static_assert(int(UnexpectedBreak) == int(CborErrorUnexpectedBreak));
        return QStringLiteral("Invalid CBOR stream: unexpected 'break' byte");
    case UnknownType:
        static_assert(int(UnknownType) == int(CborErrorUnknownType));
        return QStringLiteral("Invalid CBOR stream: unknown type");
    case IllegalType:
        static_assert(int(IllegalType) == int(CborErrorIllegalType));
        return QStringLiteral("Invalid CBOR stream: illegal type found");
    case IllegalNumber:
        static_assert(int(IllegalNumber) == int(CborErrorIllegalNumber));
        return QStringLiteral("Invalid CBOR stream: illegal number encoding (future extension)");
    case IllegalSimpleType:
        static_assert(int(IllegalSimpleType) == int(CborErrorIllegalSimpleType));
        return QStringLiteral("Invalid CBOR stream: illegal simple type");
    case InvalidUtf8String:
        static_assert(int(InvalidUtf8String) == int(CborErrorInvalidUtf8TextString));
        return QStringLiteral("Invalid CBOR stream: invalid UTF-8 text string");
    case DataTooLarge:
        static_assert(int(DataTooLarge) == int(CborErrorDataTooLarge));
        return QStringLiteral("Internal limitation: data set too large");
    case NestingTooDeep:
        static_assert(int(NestingTooDeep) == int(CborErrorNestingTooDeep));
        return QStringLiteral("Internal limitation: data nesting too deep");
    case UnsupportedType:
        static_assert(int(UnsupportedType) == int(CborErrorUnsupportedType));
        return QStringLiteral("Internal limitation: unsupported type");
    }

    // get the error string from TinyCBOR
    CborError err = CborError(int(c));
    return QString::fromLatin1(cbor_error_string(err));
}